

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_func_num_args(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  VmFrame *pVVar1;
  jx9_vm *pVm;
  VmFrame *pFrame;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pVVar1 = pCtx->pVm->pFrame;
  if (pVVar1->pParent == (VmFrame *)0x0) {
    jx9_result_int(pCtx,-1);
  }
  else {
    jx9_result_int(pCtx,(pVVar1->sArg).nUsed);
  }
  return 0;
}

Assistant:

static int vm_builtin_func_num_args(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	VmFrame *pFrame;
	jx9_vm *pVm;
	/* Point to the target VM */
	pVm = pCtx->pVm;
	/* Current frame */
	pFrame = pVm->pFrame;
	if( pFrame->pParent == 0 ){
		SXUNUSED(nArg);
		SXUNUSED(apArg);
		/* Global frame, return -1 */
		jx9_result_int(pCtx, -1);
		return SXRET_OK;
	}
	/* Total number of arguments passed to the enclosing function */
	nArg = (int)SySetUsed(&pFrame->sArg);
	jx9_result_int(pCtx, nArg);
	return SXRET_OK;
}